

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMDataProviders.cpp
# Opt level: O0

void __thiscall
ASDCP::SilenceDataProvider::SilenceDataProvider
          (SilenceDataProvider *this,ui16_t numChannels,ui16_t bitsPerSample,ui32_t sampleRate,
          Rational *editRate)

{
  Rational local_34 [2];
  Rational *local_20;
  Rational *editRate_local;
  ui32_t sampleRate_local;
  ui16_t bitsPerSample_local;
  ui16_t numChannels_local;
  SilenceDataProvider *this_local;
  
  local_20 = editRate;
  editRate_local._0_4_ = sampleRate;
  editRate_local._4_2_ = bitsPerSample;
  editRate_local._6_2_ = numChannels;
  _sampleRate_local = this;
  PCMDataProviderInterface::PCMDataProviderInterface(&this->super_PCMDataProviderInterface);
  (this->super_PCMDataProviderInterface)._vptr_PCMDataProviderInterface =
       (_func_int **)&PTR__SilenceDataProvider_0033d678;
  (this->m_ADesc).AvgBps = 0;
  (this->m_ADesc).LinkedTrackID = 0;
  (this->m_ADesc).ContainerDuration = 0;
  (this->m_ADesc).ChannelFormat = CF_NONE;
  (this->m_ADesc).Locked = 0;
  (this->m_ADesc).ChannelCount = 0;
  (this->m_ADesc).QuantizationBits = 0;
  (this->m_ADesc).BlockAlign = 0;
  (this->m_ADesc).EditRate.Numerator = 0;
  (this->m_ADesc).EditRate.Denominator = 0;
  (this->m_ADesc).AudioSamplingRate.Numerator = 0;
  (this->m_ADesc).AudioSamplingRate.Denominator = 0;
  PCM::AudioDescriptor::AudioDescriptor(&this->m_ADesc);
  this->m_SampleSize = 0;
  this->m_SampleSize = editRate_local._4_2_ + 7 >> 3;
  (this->m_ADesc).EditRate = *local_20;
  Rational::Rational(local_34,(ui32_t)editRate_local,1);
  (this->m_ADesc).AudioSamplingRate = local_34[0];
  (this->m_ADesc).ChannelCount = (uint)editRate_local._6_2_;
  (this->m_ADesc).QuantizationBits = (uint)editRate_local._4_2_;
  (this->m_ADesc).BlockAlign = (uint)editRate_local._6_2_ * this->m_SampleSize;
  (this->m_ADesc).AvgBps = (ui32_t)editRate_local * (this->m_ADesc).BlockAlign;
  return;
}

Assistant:

ASDCP::SilenceDataProvider::SilenceDataProvider(const ui16_t numChannels, const ui16_t bitsPerSample,
                                                const ui32_t sampleRate, const ASDCP::Rational& editRate)
    : m_ADesc(), m_SampleSize(0)
{
    m_SampleSize = ((bitsPerSample + 7) / 8);
    m_ADesc.EditRate = editRate;
    m_ADesc.AudioSamplingRate = Rational(sampleRate, 1);
    m_ADesc.ChannelCount = numChannels;
    m_ADesc.QuantizationBits = bitsPerSample;
    m_ADesc.BlockAlign = numChannels * m_SampleSize;
    m_ADesc.AvgBps = sampleRate * m_ADesc.BlockAlign;
}